

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

void set_cost(GridNode *node,GridNode *start,GridNode *target)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar5 = (node->pos).x;
  iVar2 = (node->pos).y;
  iVar6 = (start->pos).x - iVar5;
  iVar1 = -iVar6;
  if (0 < iVar6) {
    iVar1 = iVar6;
  }
  iVar4 = (start->pos).y - iVar2;
  iVar6 = -iVar4;
  if (0 < iVar4) {
    iVar6 = iVar4;
  }
  iVar4 = iVar6;
  if (iVar1 < iVar6) {
    iVar4 = iVar1;
  }
  lVar7 = (long)iVar1 - (long)iVar6;
  lVar3 = -lVar7;
  if (0 < lVar7) {
    lVar3 = lVar7;
  }
  node->gCost = iVar4 * 0xe + (int)lVar3 * 10;
  iVar5 = (target->pos).x - iVar5;
  iVar1 = -iVar5;
  if (0 < iVar5) {
    iVar1 = iVar5;
  }
  iVar2 = (target->pos).y - iVar2;
  iVar5 = -iVar2;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  iVar2 = iVar5;
  if (iVar1 < iVar5) {
    iVar2 = iVar1;
  }
  lVar7 = (long)iVar1 - (long)iVar5;
  lVar3 = -lVar7;
  if (0 < lVar7) {
    lVar3 = lVar7;
  }
  node->hCost = iVar2 * 0xe + (int)lVar3 * 10;
  return;
}

Assistant:

int get_distance_bw_nodes(GridNode *a, GridNode *b)
{
    int deltaX = absolute(a->pos.x - b->pos.x);
    int deltaY = absolute(a->pos.y - b->pos.y);
#if USE_ACCURATE_DIST
    int dist = (int)(sqrt((deltaX * deltaX) + (deltaY * deltaY)));
#else
    int dist = 14 * min(deltaX, deltaY) + 10 * (max(deltaX, deltaY) - min(deltaX, deltaY));
#endif
    return dist;
}